

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void jinit_downsampler(j_compress_ptr cinfo)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  jpeg_downsampler *pjVar6;
  int v_out_group;
  int h_out_group;
  int v_in_group;
  int h_in_group;
  boolean smoothok;
  jpeg_component_info *compptr;
  int ci;
  my_downsample_ptr downsample;
  j_compress_ptr cinfo_local;
  
  bVar3 = true;
  pjVar6 = (jpeg_downsampler *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0xa8);
  cinfo->downsample = pjVar6;
  pjVar6->start_pass = start_pass_downsample;
  pjVar6->downsample = sep_downsample;
  pjVar6->need_context_rows = 0;
  if (cinfo->CCIR601_sampling != 0) {
    cinfo->err->msg_code = 0x1a;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  compptr._4_4_ = 0;
  _h_in_group = cinfo->comp_info;
  for (; compptr._4_4_ < cinfo->num_components; compptr._4_4_ = compptr._4_4_ + 1) {
    iVar4 = (_h_in_group->h_samp_factor * _h_in_group->DCT_h_scaled_size) /
            cinfo->min_DCT_h_scaled_size;
    iVar5 = (_h_in_group->v_samp_factor * _h_in_group->DCT_v_scaled_size) /
            cinfo->min_DCT_v_scaled_size;
    iVar1 = cinfo->max_h_samp_factor;
    iVar2 = cinfo->max_v_samp_factor;
    *(int *)((long)&pjVar6[4].downsample + (long)compptr._4_4_ * 4) = iVar5;
    if ((iVar1 == iVar4) && (iVar2 == iVar5)) {
      if (cinfo->smoothing_factor == 0) {
        (&pjVar6[1].start_pass)[compptr._4_4_] = fullsize_downsample;
      }
      else {
        (&pjVar6[1].start_pass)[compptr._4_4_] = fullsize_smooth_downsample;
        pjVar6->need_context_rows = 1;
      }
    }
    else if ((iVar1 == iVar4 * 2) && (iVar2 == iVar5)) {
      bVar3 = false;
      (&pjVar6[1].start_pass)[compptr._4_4_] = h2v1_downsample;
    }
    else if ((iVar1 == iVar4 * 2) && (iVar2 == iVar5 * 2)) {
      if (cinfo->smoothing_factor == 0) {
        (&pjVar6[1].start_pass)[compptr._4_4_] = h2v2_downsample;
      }
      else {
        (&pjVar6[1].start_pass)[compptr._4_4_] = h2v2_smooth_downsample;
        pjVar6->need_context_rows = 1;
      }
    }
    else if ((iVar1 % iVar4 == 0) && (iVar2 % iVar5 == 0)) {
      bVar3 = false;
      (&pjVar6[1].start_pass)[compptr._4_4_] = int_downsample;
      *(char *)((long)&pjVar6[6].start_pass + (long)compptr._4_4_) = (char)(iVar1 / iVar4);
      *(char *)((long)&pjVar6[6].downsample + (long)compptr._4_4_ + 2) = (char)(iVar2 / iVar5);
    }
    else {
      cinfo->err->msg_code = 0x27;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    _h_in_group = _h_in_group + 1;
  }
  if ((cinfo->smoothing_factor != 0) && (!bVar3)) {
    cinfo->err->msg_code = 0x65;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,0);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_downsampler (j_compress_ptr cinfo)
{
  my_downsample_ptr downsample;
  int ci;
  jpeg_component_info * compptr;
  boolean smoothok = TRUE;
  int h_in_group, v_in_group, h_out_group, v_out_group;

  downsample = (my_downsample_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_downsampler));
  cinfo->downsample = (struct jpeg_downsampler *) downsample;
  downsample->pub.start_pass = start_pass_downsample;
  downsample->pub.downsample = sep_downsample;
  downsample->pub.need_context_rows = FALSE;

  if (cinfo->CCIR601_sampling)
    ERREXIT(cinfo, JERR_CCIR601_NOTIMPL);

  /* Verify we can handle the sampling factors, and set up method pointers */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Compute size of an "output group" for DCT scaling.  This many samples
     * are to be converted from max_h_samp_factor * max_v_samp_factor pixels.
     */
    h_out_group = (compptr->h_samp_factor * compptr->DCT_h_scaled_size) /
		  cinfo->min_DCT_h_scaled_size;
    v_out_group = (compptr->v_samp_factor * compptr->DCT_v_scaled_size) /
		  cinfo->min_DCT_v_scaled_size;
    h_in_group = cinfo->max_h_samp_factor;
    v_in_group = cinfo->max_v_samp_factor;
    downsample->rowgroup_height[ci] = v_out_group; /* save for use later */
    if (h_in_group == h_out_group && v_in_group == v_out_group) {
#ifdef INPUT_SMOOTHING_SUPPORTED
      if (cinfo->smoothing_factor) {
	downsample->methods[ci] = fullsize_smooth_downsample;
	downsample->pub.need_context_rows = TRUE;
      } else
#endif
	downsample->methods[ci] = fullsize_downsample;
    } else if (h_in_group == h_out_group * 2 &&
	       v_in_group == v_out_group) {
      smoothok = FALSE;
      downsample->methods[ci] = h2v1_downsample;
    } else if (h_in_group == h_out_group * 2 &&
	       v_in_group == v_out_group * 2) {
#ifdef INPUT_SMOOTHING_SUPPORTED
      if (cinfo->smoothing_factor) {
	downsample->methods[ci] = h2v2_smooth_downsample;
	downsample->pub.need_context_rows = TRUE;
      } else
#endif
	downsample->methods[ci] = h2v2_downsample;
    } else if ((h_in_group % h_out_group) == 0 &&
	       (v_in_group % v_out_group) == 0) {
      smoothok = FALSE;
      downsample->methods[ci] = int_downsample;
      downsample->h_expand[ci] = (UINT8) (h_in_group / h_out_group);
      downsample->v_expand[ci] = (UINT8) (v_in_group / v_out_group);
    } else
      ERREXIT(cinfo, JERR_FRACT_SAMPLE_NOTIMPL);
  }

#ifdef INPUT_SMOOTHING_SUPPORTED
  if (cinfo->smoothing_factor && !smoothok)
    TRACEMS(cinfo, 0, JTRC_SMOOTH_NOTIMPL);
#endif
}